

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int __thiscall AES256CBCDecrypt::Decrypt(AES256CBCDecrypt *this,uchar *data,int size,uchar *out)

{
  uchar *puVar1;
  long lVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [11];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  int i;
  long lVar31;
  AES_KEY *key;
  byte bVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  uchar *puVar38;
  long in_FS_OFFSET;
  bool bVar39;
  undefined1 auVar40 [16];
  char cVar41;
  char cVar43;
  char cVar44;
  char cVar45;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [11];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar48 [15];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar34 = 0;
  iVar37 = 0;
  if (((((size & 0xfU) == 0) && (iVar37 = iVar34, data != (uchar *)0x0)) && (size != 0)) &&
     (out != (uchar *)0x0)) {
    bVar39 = this->pad;
    uVar35 = 0;
    puVar38 = this->iv;
    do {
      key = (AES_KEY *)out;
      puVar1 = data + uVar35;
      AES_decrypt((uchar *)this,(uchar *)0xe,key);
      lVar31 = 0;
      do {
        bVar32 = *(byte *)((long)key->rd_key + lVar31) ^ puVar38[lVar31];
        *(byte *)((long)key->rd_key + lVar31) = bVar32;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 0x10);
      uVar35 = uVar35 + 0x10;
      out = (uchar *)(key->rd_key + 4);
      puVar38 = puVar1;
    } while (uVar35 != (uint)size);
    uVar36 = 1;
    if (bVar39 != false) {
      bVar39 = (byte)(bVar32 - 0x11) < 0xf0;
      uVar33 = (uint)bVar32;
      if (bVar39) {
        uVar33 = 0;
      }
      iVar37 = 0x10 - uVar33;
      auVar40 = ZEXT216(CONCAT11((char)uVar33,(char)uVar33));
      auVar49._0_4_ = -(uint)(3 < iVar37);
      auVar49._4_4_ = -(uint)(2 < iVar37);
      auVar49._8_4_ = -(uint)(1 < iVar37);
      auVar49._12_4_ = -(uint)(0 < iVar37);
      auVar42 = pshuflw(auVar40,auVar40,0);
      auVar54._0_4_ = -(uint)(7 < iVar37);
      auVar54._4_4_ = -(uint)(6 < iVar37);
      auVar54._8_4_ = -(uint)(5 < iVar37);
      auVar54._12_4_ = -(uint)(4 < iVar37);
      auVar52._0_4_ = -(uint)(0xb < iVar37);
      auVar52._4_4_ = -(uint)(10 < iVar37);
      auVar52._8_4_ = -(uint)(9 < iVar37);
      auVar52._12_4_ = -(uint)(8 < iVar37);
      auVar49 = packssdw(auVar54,auVar49);
      auVar40._0_4_ = -(uint)(0xf < iVar37);
      auVar40._4_4_ = -(uint)(0xe < iVar37);
      auVar40._8_4_ = -(uint)(0xd < iVar37);
      auVar40._12_4_ = -(uint)(0xc < iVar37);
      auVar40 = packssdw(auVar40,auVar52);
      auVar49 = packsswb(auVar40,auVar49);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar40 = *(undefined1 (*) [16])key->rd_key;
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar40._0_13_;
      auVar19[0xe] = auVar40[7];
      auVar20[0xc] = auVar40[6];
      auVar20._0_12_ = auVar40._0_12_;
      auVar20._13_2_ = auVar19._13_2_;
      auVar21[0xb] = 0;
      auVar21._0_11_ = auVar40._0_11_;
      auVar21._12_3_ = auVar20._12_3_;
      auVar22[10] = auVar40[5];
      auVar22._0_10_ = auVar40._0_10_;
      auVar22._11_4_ = auVar21._11_4_;
      auVar23[9] = 0;
      auVar23._0_9_ = auVar40._0_9_;
      auVar23._10_5_ = auVar22._10_5_;
      auVar24[8] = auVar40[4];
      auVar24._0_8_ = auVar40._0_8_;
      auVar24._9_6_ = auVar23._9_6_;
      auVar53[7] = 0;
      auVar53._0_7_ = auVar24._8_7_;
      auVar27._7_8_ = 0;
      auVar27._0_7_ = auVar24._8_7_;
      auVar29._1_8_ = SUB158(auVar27 << 0x40,7);
      auVar29[0] = auVar40[3];
      auVar29._9_6_ = 0;
      auVar28._1_10_ = SUB1510(auVar29 << 0x30,5);
      auVar28[0] = auVar40[2];
      auVar30._11_4_ = 0;
      auVar30._0_11_ = auVar28;
      auVar25[2] = auVar40[1];
      auVar25._0_2_ = auVar40._0_2_;
      auVar25._3_12_ = SUB1512(auVar30 << 0x20,3);
      auVar26._2_13_ = auVar25._2_13_;
      auVar26._0_2_ = auVar40._0_2_ & 0xff;
      auVar53._8_4_ = auVar26._0_4_;
      auVar53._12_4_ = auVar28._0_4_;
      auVar54 = pshuflw(auVar53,auVar53,0x1b);
      auVar54 = pshufhw(auVar54,auVar54,0x1b);
      auVar50[8] = auVar40[8];
      auVar50[9] = 0;
      auVar50[10] = auVar40[9];
      auVar47._0_10_ = (unkuint10)auVar40[0xc] << 0x40;
      auVar47[10] = auVar40[0xd];
      auVar48[0xb] = 0;
      auVar48._0_11_ = auVar47;
      auVar48[0xc] = auVar40[0xe];
      auVar48[0xd] = 0;
      auVar48[0xe] = auVar40[0xf];
      auVar50[3] = 0;
      auVar50._0_3_ = auVar47._8_3_;
      auVar50._4_3_ = auVar48._12_3_;
      auVar50[7] = 0;
      auVar50[0xb] = 0;
      auVar50._12_3_ = (int3)(CONCAT16(auVar40[0xb],(uint6)auVar40[10] << 0x20) >> 0x20);
      auVar50[0xf] = 0;
      auVar40 = pshuflw(auVar50,auVar50,0x1b);
      auVar40 = pshufhw(auVar40,auVar40,0x1b);
      sVar3 = auVar40._0_2_;
      sVar4 = auVar40._2_2_;
      sVar5 = auVar40._4_2_;
      sVar6 = auVar40._6_2_;
      sVar7 = auVar40._8_2_;
      sVar8 = auVar40._10_2_;
      sVar9 = auVar40._12_2_;
      sVar10 = auVar40._14_2_;
      sVar11 = auVar54._0_2_;
      sVar12 = auVar54._2_2_;
      sVar13 = auVar54._4_2_;
      sVar14 = auVar54._6_2_;
      sVar15 = auVar54._8_2_;
      sVar16 = auVar54._10_2_;
      sVar17 = auVar54._12_2_;
      sVar18 = auVar54._14_2_;
      cVar41 = auVar42[0];
      auVar51[0] = -((char)((0 < sVar3) * (sVar3 < 0x100) * auVar40[0] - (0xff < sVar3)) == cVar41);
      cVar43 = auVar42[1];
      auVar51[1] = -((char)((0 < sVar4) * (sVar4 < 0x100) * auVar40[2] - (0xff < sVar4)) == cVar43);
      cVar44 = auVar42[2];
      auVar51[2] = -((char)((0 < sVar5) * (sVar5 < 0x100) * auVar40[4] - (0xff < sVar5)) == cVar44);
      cVar45 = auVar42[3];
      auVar51[3] = -((char)((0 < sVar6) * (sVar6 < 0x100) * auVar40[6] - (0xff < sVar6)) == cVar45);
      auVar51[4] = -((char)((0 < sVar7) * (sVar7 < 0x100) * auVar40[8] - (0xff < sVar7)) == cVar41);
      auVar51[5] = -((char)((0 < sVar8) * (sVar8 < 0x100) * auVar40[10] - (0xff < sVar8)) == cVar43)
      ;
      auVar51[6] = -((char)((0 < sVar9) * (sVar9 < 0x100) * auVar40[0xc] - (0xff < sVar9)) == cVar44
                    );
      auVar51[7] = -((char)((0 < sVar10) * (sVar10 < 0x100) * auVar40[0xe] - (0xff < sVar10)) ==
                    cVar45);
      auVar51[8] = -((char)((0 < sVar11) * (sVar11 < 0x100) * auVar54[0] - (0xff < sVar11)) ==
                    cVar41);
      auVar51[9] = -((char)((0 < sVar12) * (sVar12 < 0x100) * auVar54[2] - (0xff < sVar12)) ==
                    cVar43);
      auVar51[10] = -((char)((0 < sVar13) * (sVar13 < 0x100) * auVar54[4] - (0xff < sVar13)) ==
                     cVar44);
      auVar51[0xb] = -((char)((0 < sVar14) * (sVar14 < 0x100) * auVar54[6] - (0xff < sVar14)) ==
                      cVar45);
      auVar51[0xc] = -((char)((0 < sVar15) * (sVar15 < 0x100) * auVar54[8] - (0xff < sVar15)) ==
                      cVar41);
      auVar51[0xd] = -((char)((0 < sVar16) * (sVar16 < 0x100) * auVar54[10] - (0xff < sVar16)) ==
                      cVar43);
      auVar51[0xe] = -((char)((0 < sVar17) * (sVar17 < 0x100) * auVar54[0xc] - (0xff < sVar17)) ==
                      cVar44);
      auVar51[0xf] = -((char)((0 < sVar18) * (sVar18 < 0x100) * auVar54[0xe] - (0xff < sVar18)) ==
                      cVar45);
      auVar40 = psllw((auVar51 | auVar49) ^ auVar46 | ZEXT116(bVar39),7);
      uVar36 = (uint)((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar40 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar40 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar40 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar40 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar40 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar40 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar40 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar40 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar40 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar40[0xf]);
      uVar35 = (ulong)((int)uVar35 - uVar33);
    }
    iVar37 = (int)uVar35 * uVar36;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar37;
  }
  __stack_chk_fail();
}

Assistant:

int AES256CBCDecrypt::Decrypt(const unsigned char* data, int size, unsigned char* out) const
{
    return CBCDecrypt(dec, iv, data, size, pad, out);
}